

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

CBString * __thiscall
Bstrlib::CBString::operator+(CBString *__return_storage_ptr__,CBString *this,uchar *s)

{
  CBStringException *this_00;
  allocator local_69;
  string local_68;
  undefined1 local_48 [8];
  CBStringException bstr__cppwrapper_exception;
  uchar *s_local;
  CBString *this_local;
  CBString *retval;
  
  bstr__cppwrapper_exception.msg.field_2._8_8_ = s;
  if (s != (uchar *)0x0) {
    CBString(__return_storage_ptr__,this);
    operator+=(__return_storage_ptr__,(char *)bstr__cppwrapper_exception.msg.field_2._8_8_);
    return __return_storage_ptr__;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_68,"CBString::Failure in + (unsigned char *) operator, NULL",&local_69
            );
  CBStringException::CBStringException((CBStringException *)local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(this_00,(CBStringException *)local_48);
  __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

const CBString CBString::operator + (const unsigned char *s) const {
	if (s == NULL) bstringThrow ("Failure in + (unsigned char *) operator, NULL");
	CBString retval (*this);
	retval += (const char *) s;
	return retval;
}